

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_neg(mp_int *a,mp_int *b)

{
  int iVar1;
  uint uVar2;
  
  if ((a != b) && (iVar1 = mp_copy(a,b), iVar1 != 0)) {
    return iVar1;
  }
  uVar2 = 0;
  if (b->used != 0) {
    uVar2 = (uint)(a->sign == 0);
  }
  b->sign = uVar2;
  return 0;
}

Assistant:

int mp_neg (mp_int * a, mp_int * b)
{
  int     res;
  if (a != b) {
     if ((res = mp_copy (a, b)) != MP_OKAY) {
        return res;
     }
  }

  if (mp_iszero(b) != MP_YES) {
     b->sign = (a->sign == MP_ZPOS) ? MP_NEG : MP_ZPOS;
  } else {
     b->sign = MP_ZPOS;
  }

  return MP_OKAY;
}